

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stopwatch.cpp
# Opt level: O0

uint64_t __thiscall Utils::Stopwatch::total_time(Stopwatch *this)

{
  duration<long,_std::ratio<1L,_1000000000L>_> local_40;
  duration<long,_std::ratio<1L,_1000L>_> local_38;
  duration<long,_std::ratio<1L,_1000000L>_> local_30;
  duration<long,_std::ratio<1L,_1000000000L>_> local_28;
  duration<unsigned_long,_std::ratio<1L,_1000000000L>_> local_20;
  duration<unsigned_long,_std::ratio<1L,_1000000000L>_> total;
  Stopwatch *this_local;
  
  total.__r = (rep_conflict)this;
  local_28.__r = (rep)std::chrono::operator-(&this->stop_time,&this->start_time);
  std::chrono::duration<unsigned_long,std::ratio<1l,1000000000l>>::
  duration<long,std::ratio<1l,1000000000l>,void>
            ((duration<unsigned_long,std::ratio<1l,1000000000l>> *)&local_20,&local_28);
  if (this->unity_type == 1) {
    local_38.__r = (rep)std::chrono::
                        duration_cast<std::chrono::duration<long,std::ratio<1l,1000l>>,unsigned_long,std::ratio<1l,1000000000l>>
                                  (&local_20);
    this_local = (Stopwatch *)std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count(&local_38);
  }
  else if (this->unity_type == 2) {
    local_30.__r = (rep)std::chrono::
                        duration_cast<std::chrono::duration<long,std::ratio<1l,1000000l>>,unsigned_long,std::ratio<1l,1000000000l>>
                                  (&local_20);
    this_local = (Stopwatch *)
                 std::chrono::duration<long,_std::ratio<1L,_1000000L>_>::count(&local_30);
  }
  else {
    local_40.__r = (rep)std::chrono::
                        duration_cast<std::chrono::duration<long,std::ratio<1l,1000000000l>>,unsigned_long,std::ratio<1l,1000000000l>>
                                  (&local_20);
    this_local = (Stopwatch *)
                 std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::count(&local_40);
  }
  return (uint64_t)this_local;
}

Assistant:

uint64_t Utils::Stopwatch::total_time()
{
    std::chrono::duration<uint64_t, std::nano> total = (this->stop_time - this->start_time);
    switch (this->unity_type)
    {
        case Utils::MICROSECONDS:
            return std::chrono::duration_cast<std::chrono::microseconds>(total).count();
        case Utils::MILISECONDS:
            return std::chrono::duration_cast<std::chrono::milliseconds>(total).count();
        default:
            return std::chrono::duration_cast<std::chrono::nanoseconds>(total).count();
    }
    return 0;
}